

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::Context::Context(Context *this,Value *values,shared_ptr<minja::Context> *parent)

{
  bool bVar1;
  runtime_error *this_00;
  undefined8 *in_RDI;
  bool in_stack_00000123;
  int in_stack_00000124;
  Value *in_stack_00000128;
  Value *in_stack_ffffffffffffff78;
  Value *this_01;
  char *__lhs;
  string local_38 [56];
  
  std::enable_shared_from_this<minja::Context>::enable_shared_from_this
            ((enable_shared_from_this<minja::Context> *)0x29adaf);
  *in_RDI = &PTR__Context_0041c3e0;
  this_01 = (Value *)(in_RDI + 3);
  Value::Value(this_01,in_stack_ffffffffffffff78);
  __lhs = (char *)(in_RDI + 0xd);
  std::shared_ptr<minja::Context>::shared_ptr
            ((shared_ptr<minja::Context> *)this_01,
             (shared_ptr<minja::Context> *)in_stack_ffffffffffffff78);
  bVar1 = Value::is_object((Value *)0x29adfb);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    Value::dump_abi_cxx11_(in_stack_00000128,in_stack_00000124,in_stack_00000123);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_01);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Context(Value && values, const std::shared_ptr<Context> & parent = nullptr) : values_(std::move(values)), parent_(parent) {
        if (!values_.is_object()) throw std::runtime_error("Context values must be an object: " + values_.dump());
    }